

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessage
          (BaseCase *this,MessageData *message,GLenum source,GLenum type,GLuint id,GLenum severity)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar3 = verifyMessageExists(this,(MessageData *)(ulong)(message->id).source,(message->id).type,
                              source);
  if (bVar3) {
    verifyMessageString(this,message);
    verifyMessageGroup(this,message,source,type);
    if ((message->id).id != id) {
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Incorrect message id","")
      ;
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Message id was ",0xf);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," when it should have been ",0x1a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
    if (message->severity != 0x826b) {
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Incorrect message severity","");
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Message severity was ",0x15);
      local_1c0.m_value = message->severity;
      local_1c0.m_getName = glu::getDebugMessageSeverityName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," when it should have been ",0x1a);
      local_1d0.m_getName = glu::getDebugMessageSeverityName;
      local_1d0.m_value = 0x826b;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
  }
  return;
}

Assistant:

void BaseCase::verifyMessage (const MessageData& message, GLenum source, GLenum type, GLuint id, GLenum severity)
{
	TestLog& log = m_testCtx.getLog();

	if (verifyMessageExists(message, source, type))
	{
		verifyMessageString(message);
		verifyMessageGroup(message, source, type);

		if (message.id.id != id)
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message id");
			log << TestLog::Message << "Message id was " << message.id.id
				<< " when it should have been " << id << TestLog::EndMessage;
		}

		if (message.severity != severity)
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message severity");
			log << TestLog::Message << "Message severity was " << glu::getDebugMessageSeverityStr(message.severity)
				<< " when it should have been " << glu::getDebugMessageSeverityStr(severity) << TestLog::EndMessage;
		}
	}
}